

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_buffer_header_with_size(void *buf,size_t *bufsiz,char *fid)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = 5;
  if (((ulong)buf & 3) == 0) {
    uVar2 = *bufsiz;
    iVar3 = 6;
    if ((uVar2 >> 3 < 0x1fffffff) && (iVar3 = 1, 0xb < uVar2)) {
      iVar3 = 0x24;
      if ((ulong)*buf <= uVar2 - 4) {
        if (fid != (char *)0x0) {
          bVar1 = *fid;
          uVar4 = (uint)bVar1;
          if (bVar1 != 0) {
            if (fid[1] != '\0') {
              uVar4 = (uint)CONCAT11(fid[1],bVar1);
              if (fid[2] != 0) {
                uVar4 = uVar4 | (uint)(byte)fid[3] << 0x18 | (uint)(byte)fid[2] << 0x10;
              }
            }
            if (*(uint *)((long)buf + 4) != uVar4) {
              return 2;
            }
          }
        }
        *bufsiz = (ulong)*buf + 4;
        return 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int flatcc_verify_buffer_header_with_size(const void *buf, size_t *bufsiz, const char *fid)
{
    thash_t id, id2;
    size_t size_field;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(*bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);

    /* Size field, offset field, optional identifier field that must be read even if not present. */
    verify(*bufsiz >= 2 * offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);

    size_field = (size_t)read_uoffset(buf, 0);
    verify_runtime(size_field <= *bufsiz - offset_size, flatcc_verify_error_runtime_buffer_size_less_than_size_field);
    if (fid != 0) {
        id2 = read_thash_identifier(fid);
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    *bufsiz = size_field + offset_size;
    return flatcc_verify_ok;
}